

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

int Ivy_ManFindBoolCut_rec
              (Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume,Ivy_Obj_t *pPivot)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  
  if (pObj == pPivot) {
    uVar2 = vLeaves->nSize;
    if (0 < (long)(int)uVar2) {
      lVar6 = 0;
      do {
        if ((Ivy_Obj_t *)vLeaves->pArray[lVar6] == pObj) goto LAB_0074891f;
        lVar6 = lVar6 + 1;
      } while ((int)uVar2 != lVar6);
    }
    uVar1 = vLeaves->nCap;
    if (uVar2 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vLeaves->pArray,0x80);
        }
        vLeaves->pArray = ppvVar5;
        iVar3 = 0x10;
      }
      else {
        iVar3 = uVar1 * 2;
        if (iVar3 <= (int)uVar1) goto LAB_0074890c;
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
        }
        vLeaves->pArray = ppvVar5;
      }
      vLeaves->nCap = iVar3;
    }
LAB_0074890c:
    iVar3 = vLeaves->nSize;
    vLeaves->nSize = iVar3 + 1;
    vLeaves->pArray[iVar3] = pObj;
LAB_0074891f:
    uVar2 = vVolume->nSize;
    if (0 < (long)(int)uVar2) {
      lVar6 = 0;
      do {
        if ((Ivy_Obj_t *)vVolume->pArray[lVar6] == pObj) {
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while ((int)uVar2 != lVar6);
    }
  }
  else {
    if ((*(uint *)&pObj->field_0x8 & 0x10) != 0) {
      return 0;
    }
    uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
    if (uVar2 == 1) {
      return 0;
    }
    if (uVar2 == 4) {
      return 0;
    }
    if (uVar2 == 7) {
      iVar3 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      if (iVar3 == 0) {
        return 0;
      }
      uVar2 = vVolume->nSize;
      if (0 < (long)(int)uVar2) {
        lVar6 = 0;
        do {
          if ((Ivy_Obj_t *)vVolume->pArray[lVar6] == pObj) {
            return 1;
          }
          lVar6 = lVar6 + 1;
        } while ((int)uVar2 != lVar6);
      }
    }
    else {
      if (uVar2 - 7 < 0xfffffffe) {
        __assert_fail("Ivy_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                      ,0xf5,
                      "int Ivy_ManFindBoolCut_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Ivy_Obj_t *)"
                     );
      }
      iVar3 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      iVar4 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      if (iVar3 == 0 && iVar4 == 0) {
        return 0;
      }
      if (iVar3 == 0) {
        Vec_PtrPushUnique(vLeaves,(void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        Vec_PtrPushUnique(vVolume,(void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      }
      if (iVar4 == 0) {
        Vec_PtrPushUnique(vLeaves,(void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
        Vec_PtrPushUnique(vVolume,(void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      }
      uVar2 = vVolume->nSize;
      if (0 < (long)(int)uVar2) {
        lVar6 = 0;
        do {
          if ((Ivy_Obj_t *)vVolume->pArray[lVar6] == pObj) {
            return 1;
          }
          lVar6 = lVar6 + 1;
        } while ((int)uVar2 != lVar6);
      }
    }
  }
  uVar1 = vVolume->nCap;
  if (uVar2 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar5;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_007489aa;
      if (vVolume->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vVolume->pArray,(ulong)uVar1 << 4);
      }
      vVolume->pArray = ppvVar5;
    }
    vVolume->nCap = iVar3;
  }
LAB_007489aa:
  iVar3 = vVolume->nSize;
  vVolume->nSize = iVar3 + 1;
  vVolume->pArray[iVar3] = pObj;
  return 1;
}

Assistant:

int Ivy_ManFindBoolCut_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume, Ivy_Obj_t * pPivot )
{
    int RetValue0, RetValue1;
    if ( pObj == pPivot )
    {
        Vec_PtrPushUnique( vLeaves, pObj );
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;        
    }
    if ( pObj->fMarkA )
        return 0;

//    assert( !Ivy_ObjIsCi(pObj) );
    if ( Ivy_ObjIsCi(pObj) )
        return 0;

    if ( Ivy_ObjIsBuf(pObj) )
    {
        RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
        if ( !RetValue0 )
            return 0;
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;
    }
    assert( Ivy_ObjIsNode(pObj) );
    RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
    RetValue1 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin1(pObj), vLeaves, vVolume, pPivot );
    if ( !RetValue0 && !RetValue1 )
        return 0;
    // add new leaves
    if ( !RetValue0 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin0(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin0(pObj) );
    }
    if ( !RetValue1 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin1(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin1(pObj) );
    }
    Vec_PtrPushUnique( vVolume, pObj );
    return 1;
}